

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::PointerPrinter::
     PrintValue<protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1_const>
               (protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1 *p,
               ostream *os)

{
  if (p != (protobuf_test_messages_proto2_TestAllTypesProto2_MessageSetCorrectExtension1 *)0x0) {
    std::ostream::_M_insert<void_const*>(os);
    return;
  }
  std::operator<<(os,"NULL");
  return;
}

Assistant:

static void PrintValue(T* p, ::std::ostream* os) {
    if (p == nullptr) {
      *os << "NULL";
    } else {
      // T is not a function type.  We just call << to print p,
      // relying on ADL to pick up user-defined << for their pointer
      // types, if any.
      *os << p;
    }
  }